

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::StarExpression::ToString_abi_cxx11_(string *__return_storage_ptr__,StarExpression *this)

{
  StarExpression *pSVar1;
  bool bVar2;
  pointer pPVar3;
  __node_base *p_Var4;
  __node_base *p_Var5;
  __node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  StarExpression *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    if (this->columns == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((this->relation_name)._M_string_length == 0) {
      ::std::__cxx11::string::string
                ((string *)&bStack_98,anon_var_dwarf_3b2a95a + 8,(allocator *)&local_70);
    }
    else {
      ::std::operator+(&bStack_98,&this->relation_name,".*");
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_98);
    if ((this->exclude_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var4 = &(this->exclude_list)._M_h._M_before_begin;
      bVar2 = true;
      while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
        if (!bVar2) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        QualifiedColumnName::ToString_abi_cxx11_(&bStack_98,(QualifiedColumnName *)(p_Var4 + 1));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&bStack_98);
        bVar2 = false;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    local_78 = this;
    if ((this->replace_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var5 = &(this->replace_list)._M_h._M_before_begin;
      bVar2 = true;
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        if (!bVar2) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)(p_Var5 + 5));
        (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(&bStack_98,pPVar3);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&bStack_98);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        KeywordHelper::WriteOptionallyQuoted(&bStack_98,(string *)(p_Var5 + 1),'\"',true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&bStack_98);
        bVar2 = false;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pSVar1 = local_78;
    if ((local_78->rename_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var6 = &(pSVar1->rename_list)._M_h._M_before_begin;
      bVar2 = true;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        if (!bVar2) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        QualifiedColumnName::ToString_abi_cxx11_(&bStack_98,(QualifiedColumnName *)(p_Var6 + 1));
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&bStack_98);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        KeywordHelper::WriteOptionallyQuoted(&bStack_98,(string *)(p_Var6 + 0x11),'\"',true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&bStack_98);
        bVar2 = false;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (local_78->columns == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    pPVar3 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->expr);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar3);
    ::std::operator+(&local_70,"COLUMNS(",&local_50);
    ::std::operator+(&bStack_98,&local_70,")");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&bStack_98);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string StarExpression::ToString() const {
	string result;
	if (expr) {
		D_ASSERT(columns);
		result += "COLUMNS(" + expr->ToString() + ")";
		return result;
	}
	if (columns) {
		result += "COLUMNS(";
	}
	result += relation_name.empty() ? "*" : relation_name + ".*";
	if (!exclude_list.empty()) {
		result += " EXCLUDE (";
		bool first_entry = true;
		for (auto &entry : exclude_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.ToString();
			first_entry = false;
		}
		result += ")";
	}
	if (!replace_list.empty()) {
		result += " REPLACE (";
		bool first_entry = true;
		for (auto &entry : replace_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.second->ToString();
			result += " AS ";
			result += KeywordHelper::WriteOptionallyQuoted(entry.first);
			first_entry = false;
		}
		result += ")";
	}
	if (!rename_list.empty()) {
		result += " RENAME (";
		bool first_entry = true;
		for (auto &entry : rename_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.first.ToString();
			result += " AS ";
			result += KeywordHelper::WriteOptionallyQuoted(entry.second);
			first_entry = false;
		}
		result += ")";
	}
	if (columns) {
		result += ")";
	}
	return result;
}